

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O3

nh_bool nh_view_replay_start(int fd,nh_window_procs *rwinprocs,nh_replay_info *info)

{
  nh_bool nVar1;
  nh_log_status nVar2;
  int iVar3;
  bool bVar4;
  int playmode;
  char namebuf [32];
  nh_game_info gi;
  nh_game_modes local_21c;
  char local_218 [40];
  nh_game_info local_1f0;
  
  iVar3 = exit_jmp_buf_valid + 1;
  bVar4 = exit_jmp_buf_valid == 0;
  exit_jmp_buf_valid = iVar3;
  if ((bVar4) && (iVar3 = __sigsetjmp(exit_jmp_buf,1), iVar3 != 0)) {
    return '\0';
  }
  info->actions = 0;
  info->max_actions = 0;
  info->moves = 0;
  info->max_moves = 0;
  info->nextcmd[0x30] = '\0';
  info->nextcmd[0x31] = '\0';
  info->nextcmd[0x32] = '\0';
  info->nextcmd[0x33] = '\0';
  info->nextcmd[0x34] = '\0';
  info->nextcmd[0x35] = '\0';
  info->nextcmd[0x36] = '\0';
  info->nextcmd[0x37] = '\0';
  info->nextcmd[0x38] = '\0';
  info->nextcmd[0x39] = '\0';
  info->nextcmd[0x3a] = '\0';
  info->nextcmd[0x3b] = '\0';
  info->nextcmd[0x3c] = '\0';
  info->nextcmd[0x3d] = '\0';
  info->nextcmd[0x3e] = '\0';
  info->nextcmd[0x3f] = '\0';
  info->nextcmd[0x20] = '\0';
  info->nextcmd[0x21] = '\0';
  info->nextcmd[0x22] = '\0';
  info->nextcmd[0x23] = '\0';
  info->nextcmd[0x24] = '\0';
  info->nextcmd[0x25] = '\0';
  info->nextcmd[0x26] = '\0';
  info->nextcmd[0x27] = '\0';
  info->nextcmd[0x28] = '\0';
  info->nextcmd[0x29] = '\0';
  info->nextcmd[0x2a] = '\0';
  info->nextcmd[0x2b] = '\0';
  info->nextcmd[0x2c] = '\0';
  info->nextcmd[0x2d] = '\0';
  info->nextcmd[0x2e] = '\0';
  info->nextcmd[0x2f] = '\0';
  info->nextcmd[0x10] = '\0';
  info->nextcmd[0x11] = '\0';
  info->nextcmd[0x12] = '\0';
  info->nextcmd[0x13] = '\0';
  info->nextcmd[0x14] = '\0';
  info->nextcmd[0x15] = '\0';
  info->nextcmd[0x16] = '\0';
  info->nextcmd[0x17] = '\0';
  info->nextcmd[0x18] = '\0';
  info->nextcmd[0x19] = '\0';
  info->nextcmd[0x1a] = '\0';
  info->nextcmd[0x1b] = '\0';
  info->nextcmd[0x1c] = '\0';
  info->nextcmd[0x1d] = '\0';
  info->nextcmd[0x1e] = '\0';
  info->nextcmd[0x1f] = '\0';
  info->nextcmd[0] = '\0';
  info->nextcmd[1] = '\0';
  info->nextcmd[2] = '\0';
  info->nextcmd[3] = '\0';
  info->nextcmd[4] = '\0';
  info->nextcmd[5] = '\0';
  info->nextcmd[6] = '\0';
  info->nextcmd[7] = '\0';
  info->nextcmd[8] = '\0';
  info->nextcmd[9] = '\0';
  info->nextcmd[10] = '\0';
  info->nextcmd[0xb] = '\0';
  info->nextcmd[0xc] = '\0';
  info->nextcmd[0xd] = '\0';
  info->nextcmd[0xe] = '\0';
  info->nextcmd[0xf] = '\0';
  if ((logfile == -1) && (nVar2 = nh_get_savegame_status(fd,&local_1f0), nVar2 != LS_INVALID)) {
    program_state.restoring = 1;
    iflags.disable_log = '\x01';
    logfile = fd;
    replay_begin();
    replay_read_newgame(&turntime,(int *)&local_21c,local_218,&u.initrole,&u.initrace,&u.initgend,
                        &u.initalign);
    replay_setup_windowprocs(rwinprocs);
    replay_run_cmdloop('\x01','\x01','\0');
    nh_start_game(fd,local_218,u.initrole,u.initrace,u.initgend,u.initalign,local_21c);
    program_state.restoring = 0;
    program_state.viewing = 1;
    if (orig_windowprocs.win_raw_print != (_func_void_char_ptr *)0x0) {
      memcpy(&windowprocs,&orig_windowprocs,0x90);
    }
    flush_screen();
    info->max_moves = local_1f0.moves;
    info->max_actions = loginfo.actioncount - 1;
    info->nextcmd[0] = '\0';
    update_inventory();
    make_checkpoint(0);
    nVar1 = '\x01';
  }
  else {
    nVar1 = '\0';
  }
  exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
  return nVar1;
}

Assistant:

boolean nh_view_replay_start(int fd, struct nh_window_procs *rwinprocs,
			     struct nh_replay_info *info)
{
    int playmode;
    char namebuf[PL_NSIZ];
    struct nh_game_info gi;
        
    if (!api_entry_checkpoint())
	return FALSE;
    
    memset(info, 0, sizeof(struct nh_replay_info));
    if (logfile != -1 || nh_get_savegame_status(fd, &gi) == LS_INVALID) {
	api_exit();
	return FALSE;
    }
    
    program_state.restoring = TRUE;
    iflags.disable_log = TRUE;
    logfile = fd;
    replay_begin();
    replay_read_newgame(&turntime, &playmode, namebuf,
			&u.initrole, &u.initrace, &u.initgend, &u.initalign);
    replay_setup_windowprocs(rwinprocs);

    replay_run_cmdloop(TRUE, TRUE, FALSE); /* (re)set options */
    nh_start_game(fd, namebuf, u.initrole, u.initrace, u.initgend, u.initalign, playmode);
    program_state.restoring = FALSE;
    program_state.viewing = TRUE;
    replay_restore_windowprocs();
    
    /* the win_update_screen proc in the replay_windowprocs does nothing, so
     * flush (again) after switching back to regular window procs */
    flush_screen();
    
    info->max_moves = gi.moves;
    info->max_actions = loginfo.actioncount - 1; /* - 1 for the new-game ~ */
    find_next_command(info->nextcmd, sizeof(info->nextcmd));
    update_inventory();
    make_checkpoint(0);
    
    api_exit();
    
    return TRUE;
}